

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_last(PyObject *self,PyObject *args)

{
  int iVar1;
  long lVar2;
  PyObject *pPVar3;
  xmlNodePtr node;
  PyObject *obj;
  undefined *local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:last",&local_10);
  if (iVar1 != 0) {
    if (local_10 == &_Py_NoneStruct) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)(local_10 + 0x10);
    }
    node = (xmlNodePtr)0x0;
    if ((*(uint *)(lVar2 + 8) < 0x16) && ((0x2063e6U >> (*(uint *)(lVar2 + 8) & 0x1f) & 1) != 0)) {
      node = *(xmlNodePtr *)(lVar2 + 0x20);
    }
    pPVar3 = libxml_xmlNodePtrWrap(node);
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_last(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlNodePtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:last", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

#ifdef DEBUG
    printf("libxml_last: cur = %p\n", cur);
#endif

    switch (cur->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
        case XML_HTML_DOCUMENT_NODE:
        case XML_DTD_NODE:
            res = cur->last;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->last;
		break;
            }
        default:
            res = NULL;
            break;
    }
    resultobj = libxml_xmlNodePtrWrap(res);
    return resultobj;
}